

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O1

compile_errcode __thiscall Default::Action(Default *this)

{
  pointer pcVar1;
  bool bVar2;
  SymbolName SVar3;
  compile_errcode cVar4;
  Statement *pSVar5;
  compile_errcode unaff_EBP;
  int iVar6;
  
  iVar6 = 0;
  do {
    SVar3 = SymbolQueue::GetCurrentName(handle_correct_queue);
    if (iVar6 == 2) {
      pSVar5 = (Statement *)operator_new(0x1e8);
      (pSVar5->super_AnalysisInterface)._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001745d8;
      (pSVar5->m_output_statement).super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_001744d0;
      (pSVar5->m_output_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_001741b8;
      (pSVar5->m_output_statement).m_expression.m_term.super_AnalysisInterface.
      _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00174210;
      (pSVar5->m_input_statement).super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_00174420;
      (pSVar5->m_return_statement).super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_00174478;
      (pSVar5->m_return_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_001741b8;
      (pSVar5->m_return_statement).m_expression.m_term.super_AnalysisInterface.
      _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00174210;
      (pSVar5->m_assign_statement).super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_00174528;
      (pSVar5->m_assign_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_001741b8;
      (pSVar5->m_assign_statement).m_expression.m_term.super_AnalysisInterface.
      _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00174210;
      (pSVar5->m_assign_statement).m_identifier_name._M_dataplus._M_p =
           (pointer)&(pSVar5->m_assign_statement).m_identifier_name.field_2;
      (pSVar5->m_assign_statement).m_identifier_name._M_string_length = 0;
      (pSVar5->m_assign_statement).m_identifier_name.field_2._M_local_buf[0] = '\0';
      (pSVar5->m_function_call).super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_00174630;
      (pSVar5->m_function_call).m_value_argument_list.super_AnalysisInterface.
      _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00174268;
      (pSVar5->m_function_call).m_value_argument_list.m_expression.super_AnalysisInterface.
      _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001741b8;
      (pSVar5->m_function_call).m_value_argument_list.m_expression.m_term.super_AnalysisInterface.
      _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00174210;
      (pSVar5->m_condition_statement).super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_00174688;
      (pSVar5->m_condition_statement).m_condition.super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_00174580;
      (pSVar5->m_condition_statement).m_condition.m_expression.super_AnalysisInterface.
      _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001741b8;
      (pSVar5->m_condition_statement).m_condition.m_expression.m_term.super_AnalysisInterface.
      _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00174210;
      (pSVar5->m_condition_statement).m_bottom_label._M_dataplus._M_p =
           (pointer)&(pSVar5->m_condition_statement).m_bottom_label.field_2;
      (pSVar5->m_condition_statement).m_bottom_label._M_string_length = 0;
      (pSVar5->m_condition_statement).m_bottom_label.field_2._M_local_buf[0] = '\0';
      (pSVar5->m_while_loop_statement).super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_001746e0;
      (pSVar5->m_while_loop_statement).m_condition.super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_00174580;
      (pSVar5->m_while_loop_statement).m_condition.m_expression.super_AnalysisInterface.
      _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001741b8;
      (pSVar5->m_while_loop_statement).m_condition.m_expression.m_term.super_AnalysisInterface.
      _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00174210;
      (pSVar5->m_while_loop_statement).m_top_label._M_dataplus._M_p =
           (pointer)&(pSVar5->m_while_loop_statement).m_top_label.field_2;
      (pSVar5->m_while_loop_statement).m_top_label._M_string_length = 0;
      (pSVar5->m_while_loop_statement).m_top_label.field_2._M_local_buf[0] = '\0';
      (pSVar5->m_while_loop_statement).m_bottom_label._M_dataplus._M_p =
           (pointer)&(pSVar5->m_while_loop_statement).m_bottom_label.field_2;
      (pSVar5->m_while_loop_statement).m_bottom_label._M_string_length = 0;
      (pSVar5->m_while_loop_statement).m_bottom_label.field_2._M_local_buf[0] = '\0';
      (pSVar5->m_switch_statement).super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_00174738;
      (pSVar5->m_switch_statement).m_expression.super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_001741b8;
      (pSVar5->m_switch_statement).m_expression.m_term.super_AnalysisInterface.
      _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_00174210;
      (pSVar5->m_switch_statement).m_switch_table.super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_00174790;
      (pSVar5->m_switch_statement).m_switch_table.m_switch_child_statement.super_AnalysisInterface.
      _vptr_AnalysisInterface = (_func_int **)&PTR_Parse_001747e8;
      (pSVar5->m_switch_statement).m_default.super_AnalysisInterface._vptr_AnalysisInterface =
           (_func_int **)&PTR_Parse_00174840;
      (pSVar5->m_switch_statement).m_bottom_label._M_dataplus._M_p =
           (pointer)&(pSVar5->m_switch_statement).m_bottom_label.field_2;
      (pSVar5->m_switch_statement).m_bottom_label._M_string_length = 0;
      (pSVar5->m_switch_statement).m_bottom_label.field_2._M_local_buf[0] = '\0';
      this->m_statement_ptr = pSVar5;
      cVar4 = Statement::Action(pSVar5);
      pSVar5 = this->m_statement_ptr;
      if (cVar4 == 0) {
        (*(pSVar5->super_AnalysisInterface)._vptr_AnalysisInterface[1])(pSVar5);
        pSVar5 = this->m_statement_ptr;
        iVar6 = 2;
        if (pSVar5 != (Statement *)0x0) {
          (pSVar5->super_AnalysisInterface)._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_001745d8;
          (pSVar5->m_switch_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00174738;
          pcVar1 = (pSVar5->m_switch_statement).m_bottom_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &(pSVar5->m_switch_statement).m_bottom_label.field_2) {
            operator_delete(pcVar1);
          }
          (pSVar5->m_while_loop_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_001746e0;
          pcVar1 = (pSVar5->m_while_loop_statement).m_bottom_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &(pSVar5->m_while_loop_statement).m_bottom_label.field_2) {
            operator_delete(pcVar1);
          }
          pcVar1 = (pSVar5->m_while_loop_statement).m_top_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &(pSVar5->m_while_loop_statement).m_top_label.field_2) {
            operator_delete(pcVar1);
          }
          (pSVar5->m_condition_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00174688;
          pcVar1 = (pSVar5->m_condition_statement).m_bottom_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &(pSVar5->m_condition_statement).m_bottom_label.field_2) {
            operator_delete(pcVar1);
          }
          (pSVar5->m_assign_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00174528;
          pcVar1 = (pSVar5->m_assign_statement).m_identifier_name._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &(pSVar5->m_assign_statement).m_identifier_name.field_2) {
            operator_delete(pcVar1);
          }
          operator_delete(pSVar5);
        }
        unaff_EBP = 0;
      }
      else {
        unaff_EBP = -1;
        iVar6 = 2;
        if (pSVar5 != (Statement *)0x0) {
          (pSVar5->super_AnalysisInterface)._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_001745d8;
          (pSVar5->m_switch_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00174738;
          pcVar1 = (pSVar5->m_switch_statement).m_bottom_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &(pSVar5->m_switch_statement).m_bottom_label.field_2) {
            operator_delete(pcVar1);
          }
          (pSVar5->m_while_loop_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_001746e0;
          pcVar1 = (pSVar5->m_while_loop_statement).m_bottom_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &(pSVar5->m_while_loop_statement).m_bottom_label.field_2) {
            operator_delete(pcVar1);
          }
          pcVar1 = (pSVar5->m_while_loop_statement).m_top_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &(pSVar5->m_while_loop_statement).m_top_label.field_2) {
            operator_delete(pcVar1);
          }
          (pSVar5->m_condition_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00174688;
          pcVar1 = (pSVar5->m_condition_statement).m_bottom_label._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &(pSVar5->m_condition_statement).m_bottom_label.field_2) {
            operator_delete(pcVar1);
          }
          (pSVar5->m_assign_statement).super_AnalysisInterface._vptr_AnalysisInterface =
               (_func_int **)&PTR_Parse_00174528;
          pcVar1 = (pSVar5->m_assign_statement).m_identifier_name._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar1 != &(pSVar5->m_assign_statement).m_identifier_name.field_2) {
            operator_delete(pcVar1);
          }
          operator_delete(pSVar5);
        }
      }
LAB_001331b0:
      bVar2 = false;
    }
    else {
      if (iVar6 != 1) {
        iVar6 = 1;
        if (SVar3 == DEFAULT_SYM) goto LAB_001330c1;
        unaff_EBP = -1;
        iVar6 = 0;
        goto LAB_001331b0;
      }
      iVar6 = 2;
      if (SVar3 != COLON_SYM) {
        unaff_EBP = -1;
        iVar6 = 1;
        goto LAB_001331b0;
      }
LAB_001330c1:
      SymbolQueue::NextSymbol(handle_correct_queue);
      bVar2 = true;
    }
    if (!bVar2) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

compile_errcode Default::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == DEFAULT_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == COLON_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                m_statement_ptr = new Statement;
                if ((ret = m_statement_ptr->Action()) == COMPILE_OK) {
                    m_statement_ptr->LogOutput();
                    delete(m_statement_ptr);
                    return COMPILE_OK;
                } else {
                    delete(m_statement_ptr);
                    return NOT_MATCH;
                }
            }
        }
        handle_correct_queue->NextSymbol();
    }
}